

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Parser.cpp
# Opt level: O2

bool __thiscall FIX::Parser::readFixMessage(Parser *this,string *str)

{
  bool bVar1;
  long lVar2;
  Parser *this_00;
  int length;
  size_type local_28;
  
  if (1 < (this->m_buffer)._M_string_length) {
    local_28 = std::__cxx11::string::find((char *)this,0x1ca559);
    if (local_28 == 0xffffffffffffffff) {
      return false;
    }
    this_00 = this;
    std::__cxx11::string::erase((ulong)this,0);
    length = 0;
    bVar1 = extractLength(this_00,&length,&local_28,&this->m_buffer);
    if ((((bVar1) && ((long)length + local_28 <= (this->m_buffer)._M_string_length)) &&
        (lVar2 = std::__cxx11::string::find((char *)this,0x1ca55c), lVar2 != -1)) &&
       (lVar2 = std::__cxx11::string::find((char *)this,0x1ca557), lVar2 != -1)) {
      local_28 = lVar2 + 1;
      std::__cxx11::string::assign((string *)str,(ulong)this,0);
      std::__cxx11::string::erase((ulong)this,0);
      return true;
    }
  }
  return false;
}

Assistant:

EXCEPT(MessageParseError) {
  std::string::size_type pos = 0;

  if (m_buffer.length() < 2) {
    return false;
  }
  pos = m_buffer.find("8=");
  if (pos == std::string::npos) {
    return false;
  }
  m_buffer.erase(0, pos);

  int length = 0;

  try {
    if (extractLength(length, pos, m_buffer)) {
      pos += length;
      if (m_buffer.size() < pos) {
        return false;
      }

      pos = m_buffer.find("\00110=", pos - 1);
      if (pos == std::string::npos) {
        return false;
      }
      pos += 4;
      pos = m_buffer.find("\001", pos);
      if (pos == std::string::npos) {
        return false;
      }
      pos += 1;

      str.assign(m_buffer, 0, pos);
      m_buffer.erase(0, pos);
      return true;
    }
  } catch (MessageParseError &e) {
    if (length > 0) {
      m_buffer.erase(0, pos + length);
    } else {
      m_buffer.erase();
    }

    throw e;
  }

  return false;
}